

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O0

void __thiscall
TPZGeoElRefLess<pzgeom::TPZQuadraticPyramid>::TPZGeoElRefLess
          (TPZGeoElRefLess<pzgeom::TPZQuadraticPyramid> *this,TPZVec<long> *nodeindices,int matind,
          TPZGeoMesh *mesh,int64_t *index)

{
  TPZGeoEl *in_RDI;
  int i;
  TPZGeoElSideIndex *in_stack_ffffffffffffff50;
  TPZGeoMesh *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  void **in_stack_ffffffffffffff68;
  TPZGeoEl *in_stack_ffffffffffffff70;
  int64_t *local_80;
  TPZGeoElSideIndex local_60;
  int local_48;
  undefined8 local_38;
  undefined8 local_30;
  
  local_30 = 0;
  local_38 = 0x21;
  TPZRegisterClassId::TPZRegisterClassId<TPZGeoElRefLess<pzgeom::TPZQuadraticPyramid>>
            ((TPZRegisterClassId *)in_RDI,0x21);
  TPZSavable::TPZSavable((TPZSavable *)in_RDI,&PTR_PTR_02472570);
  TPZGeoEl::TPZGeoEl(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
                     in_stack_ffffffffffffff58,(int64_t *)in_stack_ffffffffffffff50);
  *(undefined ***)in_RDI = &PTR__TPZGeoElRefLess_02472258;
  *(undefined ***)in_RDI = &PTR__TPZGeoElRefLess_02472258;
  pzgeom::TPZQuadraticPyramid::TPZQuadraticPyramid
            ((TPZQuadraticPyramid *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             (TPZVec<long> *)in_stack_ffffffffffffff58);
  local_80 = &in_RDI[2].fIndex;
  do {
    TPZGeoElSideIndex::TPZGeoElSideIndex(in_stack_ffffffffffffff50);
    local_80 = local_80 + 3;
  } while (local_80 != (int64_t *)&in_RDI[9].fNumInterfaces);
  for (local_48 = 0; local_48 < 0x13; local_48 = local_48 + 1) {
    TPZGeoElSideIndex::TPZGeoElSideIndex(in_stack_ffffffffffffff50);
    TPZGeoElSideIndex::operator=
              ((TPZGeoElSideIndex *)(&in_RDI[2].fIndex + (long)local_48 * 3),&local_60);
    TPZGeoElSideIndex::~TPZGeoElSideIndex((TPZGeoElSideIndex *)0x1bc6d68);
  }
  pzgeom::TPZNodeRep<13,_pztopology::TPZPyramid>::Initialize
            ((TPZNodeRep<13,_pztopology::TPZPyramid> *)(in_RDI + 1),in_RDI);
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess(TPZVec<int64_t> &nodeindices,int matind,TPZGeoMesh &mesh, int64_t &index) 
: TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId), TPZGeoEl(matind,mesh,index) , fGeo(nodeindices) 
{
	int i;
	for(i=0;i<TGeo::NSides;i++)fNeighbours[i] = TPZGeoElSideIndex();
    fGeo.Initialize(this);
}